

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeMemoryReportFormatter.cpp
# Opt level: O0

bool __thiscall
CodeMemoryReportFormatter::variableExists
          (CodeMemoryReportFormatter *this,SimpleString *variableName)

{
  CodeReportingAllocationNode *left;
  bool bVar1;
  SimpleString local_38;
  CodeReportingAllocationNode *local_28;
  CodeReportingAllocationNode *current;
  SimpleString *variableName_local;
  CodeMemoryReportFormatter *this_local;
  
  local_28 = this->codeReportingList_;
  current = (CodeReportingAllocationNode *)variableName;
  variableName_local = (SimpleString *)this;
  while( true ) {
    left = current;
    if (local_28 == (CodeReportingAllocationNode *)0x0) {
      return false;
    }
    SimpleString::SimpleString(&local_38,local_28->variableName_);
    bVar1 = operator==((SimpleString *)left,&local_38);
    SimpleString::~SimpleString(&local_38);
    if (bVar1) break;
    local_28 = local_28->next_;
  }
  return true;
}

Assistant:

bool CodeMemoryReportFormatter::variableExists(const SimpleString& variableName)
{
    CodeReportingAllocationNode* current = codeReportingList_;
    while (current) {
        if (variableName == current->variableName_)
            return true;
        current = current->next_;
    }
    return false;
}